

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_req_make(httpreq **preq,char *method,size_t m_len,char *scheme,size_t s_len,
                           char *authority,size_t a_len,char *path,size_t p_len)

{
  char *pcVar1;
  httpreq *local_50;
  CURLcode local_44;
  CURLcode result;
  httpreq *req;
  char *authority_local;
  size_t s_len_local;
  char *scheme_local;
  size_t m_len_local;
  char *method_local;
  httpreq **preq_local;
  
  local_44 = CURLE_OUT_OF_MEMORY;
  local_50 = (httpreq *)(*Curl_ccalloc)(1,m_len + 0x90);
  if (local_50 != (httpreq *)0x0) {
    memcpy(local_50->method,method,m_len);
    if (scheme != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(scheme,s_len);
      local_50->scheme = pcVar1;
      if (local_50->scheme == (char *)0x0) goto LAB_0015363b;
    }
    if (authority != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(authority,a_len);
      local_50->authority = pcVar1;
      if (local_50->authority == (char *)0x0) goto LAB_0015363b;
    }
    if (path != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(path,p_len);
      local_50->path = pcVar1;
      if (local_50->path == (char *)0x0) goto LAB_0015363b;
    }
    Curl_dynhds_init((dynhds *)local_50,0,0x100000);
    Curl_dynhds_init(&local_50->trailers,0,0x100000);
    local_44 = CURLE_OK;
  }
LAB_0015363b:
  if ((local_44 != CURLE_OK) && (local_50 != (httpreq *)0x0)) {
    Curl_http_req_free(local_50);
  }
  if (local_44 != CURLE_OK) {
    local_50 = (httpreq *)0x0;
  }
  *preq = local_50;
  return local_44;
}

Assistant:

CURLcode Curl_http_req_make(struct httpreq **preq,
                            const char *method, size_t m_len,
                            const char *scheme, size_t s_len,
                            const char *authority, size_t a_len,
                            const char *path, size_t p_len)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(method && m_len);

  req = calloc(1, sizeof(*req) + m_len);
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);
  if(scheme) {
    req->scheme = Curl_memdup0(scheme, s_len);
    if(!req->scheme)
      goto out;
  }
  if(authority) {
    req->authority = Curl_memdup0(authority, a_len);
    if(!req->authority)
      goto out;
  }
  if(path) {
    req->path = Curl_memdup0(path, p_len);
    if(!req->path)
      goto out;
  }
  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result ? NULL : req;
  return result;
}